

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT * createUploadToBlobContextInstance(void)

{
  LOGGER_LOG p_Var1;
  SINGLYLINKEDLIST_HANDLE pSVar2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *result;
  
  l = (LOGGER_LOG)malloc(0x28);
  if (l == (LOGGER_LOG)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"createUploadToBlobContextInstance",0x2c3,1,
                "Failed allocating IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT");
    }
  }
  else {
    memset(l,0,0x28);
    pSVar2 = singlylinkedlist_create();
    *(SINGLYLINKEDLIST_HANDLE *)(l + 0x18) = pSVar2;
    if (pSVar2 == (SINGLYLINKEDLIST_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"createUploadToBlobContextInstance",0x2cb,1,"Failed allocating list for blockIds"
                 );
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
  }
  return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)l;
}

Assistant:

static IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT* createUploadToBlobContextInstance(void)
{
    IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT* result;

    if ((result = malloc(sizeof(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT))) == NULL)
    {
        LogError("Failed allocating IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT");
    }
    else
    {
        (void)memset(result, 0, sizeof(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT));

        if ((result->blockIdList = singlylinkedlist_create()) == NULL)
        {
            LogError("Failed allocating list for blockIds");
            free(result);
            result = NULL;
        }
    }

    return result;
}